

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

GLuint ShaderDb::link_shader_files(vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  bool bVar1;
  GLuint p_shader;
  reference puVar2;
  const_iterator cStack_30;
  uint shader_id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  GLuint prg_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders_local;
  
  p_shader = (*glad_glCreateProgram)();
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(p_shaders);
  cStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(p_shaders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    (*glad_glAttachShader)(p_shader,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  (*glad_glLinkProgram)(p_shader);
  test_shader_program_compilation(p_shader,p_shaders);
  add_shader_program(p_shader,p_shaders);
  return p_shader;
}

Assistant:

GLuint ShaderDb::link_shader_files(
    const std::vector<GLuint> &p_shaders) noexcept
{
    GLuint prg_id = glCreateProgram();
    for (const auto shader_id : p_shaders)
    {
        glAttachShader(prg_id, shader_id);
    }
    glLinkProgram(prg_id);
    test_shader_program_compilation(prg_id, p_shaders);
    add_shader_program(prg_id, p_shaders);
    return prg_id;
}